

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O2

int IDAGetQuadNumErrTestFails(void *ida_mem,long *nQetfails)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    line = 0x6a7;
  }
  else {
    if (*(int *)((long)ida_mem + 0x60) != 0) {
      *nQetfails = *(long *)((long)ida_mem + 0x610);
      return 0;
    }
    msgfmt = "Illegal attempt to call before calling IDAQuadInit.";
    error_code = -0x1e;
    line = 0x6af;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,line,"IDAGetQuadNumErrTestFails",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDAGetQuadNumErrTestFails(void* ida_mem, long int* nQetfails)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (IDA_mem->ida_quadr == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUAD, __LINE__, __func__, __FILE__,
                    MSG_NO_QUAD);
    return (IDA_NO_QUAD);
  }

  *nQetfails = IDA_mem->ida_netfQ;

  return (IDA_SUCCESS);
}